

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O1

void __thiscall
basisu::basisu_frontend::compute_endpoint_clusters_within_each_parent_cluster(basisu_frontend *this)

{
  vector<basisu::vector<unsigned_int>_> *this_00;
  byte bVar1;
  uint uVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  uint *puVar6;
  char *__function;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint32_t new_size;
  vector<unsigned_int> *pvVar10;
  uint32_t cluster_index;
  uint local_3c;
  vector<basisu::vector<unsigned_int>_> *local_38;
  
  generate_block_endpoint_clusters(this);
  this_00 = &this->m_endpoint_clusters_within_each_parent_cluster;
  uVar5 = (ulong)(this->m_endpoint_clusters_within_each_parent_cluster).m_size;
  if (uVar5 != 0) {
    pvVar10 = this_00->m_p;
    lVar7 = 0;
    do {
      pvVar3 = *(void **)((long)&pvVar10->m_p + lVar7);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
      }
      lVar7 = lVar7 + 0x10;
    } while (uVar5 << 4 != lVar7);
    (this->m_endpoint_clusters_within_each_parent_cluster).m_size = 0;
  }
  uVar9 = (this->m_endpoint_parent_clusters).m_size;
  uVar2 = (this->m_endpoint_clusters_within_each_parent_cluster).m_size;
  uVar8 = uVar2 - uVar9;
  if (uVar8 != 0) {
    if (uVar2 < uVar9 || uVar8 == 0) {
      if ((this->m_endpoint_clusters_within_each_parent_cluster).m_capacity < uVar9) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,uVar9,uVar2 + 1 == uVar9,0x10,(object_mover)0x0,false
                  );
      }
      uVar2 = (this->m_endpoint_clusters_within_each_parent_cluster).m_size;
      if (uVar9 != uVar2) {
        memset(this_00->m_p + uVar2,0,(ulong)(uVar9 - uVar2) << 4);
      }
    }
    else {
      pvVar10 = this_00->m_p;
      lVar7 = 0;
      do {
        pvVar3 = *(void **)((long)&pvVar10[uVar9].m_p + lVar7);
        if (pvVar3 != (void *)0x0) {
          free(pvVar3);
        }
        lVar7 = lVar7 + 0x10;
      } while ((ulong)uVar8 << 4 != lVar7);
    }
    (this->m_endpoint_clusters_within_each_parent_cluster).m_size = uVar9;
  }
  if (this->m_total_blocks != 0) {
    lVar7 = 0;
    do {
      if ((this->m_block_endpoint_clusters_indices).m_size <= (uint)lVar7) {
        __function = "T &basisu::vector<basisu::vec2U>::operator[](size_t) [T = basisu::vec2U]";
LAB_002388a6:
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x178,__function);
      }
      local_3c = (this->m_block_endpoint_clusters_indices).m_p[lVar7].m_comps[0];
      if ((this->m_block_parent_endpoint_cluster).m_size <= (uint)lVar7) {
        __function = "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]";
        goto LAB_002388a6;
      }
      bVar1 = (this->m_block_parent_endpoint_cluster).m_p[lVar7];
      if ((this->m_endpoint_clusters_within_each_parent_cluster).m_size <= (uint)bVar1) {
        __function = 
        "T &basisu::vector<basisu::vector<unsigned int>>::operator[](size_t) [T = basisu::vector<unsigned int>]"
        ;
        goto LAB_002388a6;
      }
      pvVar10 = this_00->m_p;
      puVar6 = pvVar10[bVar1].m_p;
      uVar9 = pvVar10[bVar1].m_size;
      if (&local_3c < puVar6 + uVar9 && (puVar6 <= &local_3c && puVar6 != (uint *)0x0)) {
        __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x267,
                      "void basisu::vector<unsigned int>::push_back(const T &) [T = unsigned int]");
      }
      pvVar10 = pvVar10 + bVar1;
      if (pvVar10->m_capacity <= uVar9) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar10,uVar9 + 1,true,4,(object_mover)0x0,false);
      }
      pvVar10->m_p[pvVar10->m_size] = local_3c;
      pvVar10->m_size = pvVar10->m_size + 1;
      lVar7 = lVar7 + 1;
    } while ((uint)lVar7 < this->m_total_blocks);
  }
  if ((this->m_endpoint_clusters_within_each_parent_cluster).m_size != 0) {
    lVar7 = 0;
    uVar9 = 0;
    local_38 = this_00;
    do {
      uVar2 = *(uint *)((long)&local_38->m_p->m_size + lVar7);
      uVar5 = (ulong)uVar2;
      if (uVar5 == 0) {
        error_printf("basisu_frontend: verify check failed at line %i!\n",0x402);
        abort();
      }
      pvVar10 = (vector<unsigned_int> *)((long)&local_38->m_p->m_p + lVar7);
      puVar6 = pvVar10->m_p;
      lVar4 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar2 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar6,puVar6 + uVar5,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar6,puVar6 + uVar5);
      puVar6 = std::__unique<unsigned_int*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                         (pvVar10->m_p,pvVar10->m_p + pvVar10->m_size);
      vector<unsigned_int>::erase(pvVar10,puVar6,pvVar10->m_p + pvVar10->m_size);
      uVar9 = uVar9 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar9 < (this->m_endpoint_clusters_within_each_parent_cluster).m_size);
  }
  return;
}

Assistant:

void basisu_frontend::compute_endpoint_clusters_within_each_parent_cluster()
	{
		generate_block_endpoint_clusters();

		m_endpoint_clusters_within_each_parent_cluster.resize(0);
		m_endpoint_clusters_within_each_parent_cluster.resize(m_endpoint_parent_clusters.size());

		// Note: It's possible that some blocks got moved into the same cluster, but live in different parent clusters.
		for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
		{
			const uint32_t cluster_index = m_block_endpoint_clusters_indices[block_index][0];
			const uint32_t parent_cluster_index = m_block_parent_endpoint_cluster[block_index];

			m_endpoint_clusters_within_each_parent_cluster[parent_cluster_index].push_back(cluster_index);
		}

		for (uint32_t i = 0; i < m_endpoint_clusters_within_each_parent_cluster.size(); i++)
		{
			uint_vec &cluster_indices = m_endpoint_clusters_within_each_parent_cluster[i];

			BASISU_FRONTEND_VERIFY(cluster_indices.size());

			vector_sort(cluster_indices);
			
			auto last = std::unique(cluster_indices.begin(), cluster_indices.end());
			cluster_indices.erase(last, cluster_indices.end());
		}
	}